

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<unsigned_char> *
kj::heapArray<unsigned_char>
          (Array<unsigned_char> *__return_storage_ptr__,ArrayPtr<const_unsigned_char> content)

{
  size_t size;
  undefined1 local_40 [8];
  ArrayBuilder<unsigned_char> builder;
  ArrayPtr<const_unsigned_char> content_local;
  
  builder.disposer = (ArrayDisposer *)content.ptr;
  size = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&builder.disposer);
  heapArrayBuilder<unsigned_char>((ArrayBuilder<unsigned_char> *)local_40,size);
  ArrayBuilder<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char_const>&>
            ((ArrayBuilder<unsigned_char> *)local_40,
             (ArrayPtr<const_unsigned_char> *)&builder.disposer);
  ArrayBuilder<unsigned_char>::finish
            (__return_storage_ptr__,(ArrayBuilder<unsigned_char> *)local_40);
  ArrayBuilder<unsigned_char>::~ArrayBuilder((ArrayBuilder<unsigned_char> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T> heapArray(ArrayPtr<const T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}